

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O2

int run_test_tcp_bind_error_addrnotavail_1(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  undefined8 uStack_110;
  sockaddr_in addr;
  uv_tcp_t server;
  
  iVar1 = uv_ip4_addr("127.255.255.255",0x23a3,&addr);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,&server);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_bind(&server,&addr,0);
      if ((iVar1 == -99) || (iVar1 == 0)) {
        uv_close(&server,close_cb);
        uVar2 = uv_default_loop();
        uv_run(uVar2,0);
        if (close_cb_called == 1) {
          loop = (uv_loop_t *)uv_default_loop();
          close_loop(loop);
          uVar2 = uv_default_loop();
          iVar1 = uv_loop_close(uVar2);
          if (iVar1 == 0) {
            uv_library_shutdown();
            return 0;
          }
          pcVar3 = "0 == uv_loop_close(uv_default_loop())";
          uStack_110 = 0x85;
        }
        else {
          pcVar3 = "close_cb_called == 1";
          uStack_110 = 0x83;
        }
      }
      else {
        pcVar3 = "r == 0 || r == UV_EADDRNOTAVAIL";
        uStack_110 = 0x7d;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_110 = 0x79;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.255.255.255\", TEST_PORT, &addr)";
    uStack_110 = 0x76;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-bind-error.c"
          ,uStack_110,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_bind_error_addrnotavail_1) {
  struct sockaddr_in addr;
  uv_tcp_t server;
  int r;

  ASSERT(0 == uv_ip4_addr("127.255.255.255", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  /* It seems that Linux is broken here - bind succeeds. */
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0 || r == UV_EADDRNOTAVAIL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}